

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

_Bool al_wait_for_event_timed(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event,float secs)

{
  _Bool _Var1;
  ALLEGRO_TIMEOUT timeout;
  ALLEGRO_TIMEOUT local_28;
  
  heartbeat();
  al_init_timeout(&local_28,(double)(float)(~-(uint)(secs <= 0.0) & (uint)secs));
  _Var1 = do_wait_for_event(queue,ret_event,&local_28);
  return _Var1;
}

Assistant:

bool al_wait_for_event_timed(ALLEGRO_EVENT_QUEUE *queue,
   ALLEGRO_EVENT *ret_event, float secs)
{
   ALLEGRO_TIMEOUT timeout;

   ASSERT(queue);
   ASSERT(secs >= 0);

   heartbeat();

   if (secs < 0.0)
      al_init_timeout(&timeout, 0);
   else
      al_init_timeout(&timeout, secs);

   return do_wait_for_event(queue, ret_event, &timeout);
}